

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O0

size_t gmlc::utilities::getChunkEnd<std::basic_string_view<char,std::char_traits<char>>>
                 (size_t start,basic_string_view<char,_std::char_traits<char>_> *str,char ChunkStart
                 ,char ChunkEnd)

{
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  size_type newClose;
  size_type newOpen;
  size_t rlc;
  int open;
  char in_stack_ffffffffffffffcf;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  int local_18;
  
  local_18 = 1;
  local_20 = in_RDI;
  while( true ) {
    if (local_18 < 1) {
      return (size_t)local_20;
    }
    local_20 = (basic_string_view<char,_std::char_traits<char>_> *)
               std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf,0x6c6711);
    in_stack_ffffffffffffffd0 =
         (basic_string_view<char,_std::char_traits<char>_> *)
         std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf,0x6c6730);
    if (in_stack_ffffffffffffffd0 ==
        (basic_string_view<char,_std::char_traits<char>_> *)0xffffffffffffffff) break;
    if (local_20 < in_stack_ffffffffffffffd0) {
      local_18 = local_18 + 1;
    }
    else {
      local_18 = local_18 + -1;
      local_20 = in_stack_ffffffffffffffd0;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t getChunkEnd(size_t start, const X& str, char ChunkStart, char ChunkEnd)
{
    int open = 1;
    size_t rlc = start;

    while (open > 0) {
        auto newOpen = str.find_first_of(ChunkStart, rlc + 1);
        auto newClose = str.find_first_of(ChunkEnd, rlc + 1);
        if (newClose == X::npos) {
            rlc = X::npos;
            break;
        }
        if (newOpen < newClose) {
            ++open;
            rlc = newOpen;
        } else {
            --open;
            rlc = newClose;
        }
    }
    return rlc;
}